

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausProcessClauses(Clu_Man_t *p,int fRefs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Fra_Sml_t *pFVar5;
  abctime aVar6;
  Aig_MmFixed_t *p_00;
  Aig_Obj_t *pAVar7;
  abctime clk;
  int local_98;
  int nCuts;
  int j;
  int k;
  int i;
  int uScores;
  int Scores [16];
  Dar_Cut_t *pCut;
  Aig_Obj_t *pObj;
  Fra_Sml_t *pSeq;
  Fra_Sml_t *pComb;
  Aig_MmFixed_t *pMemCuts;
  int fRefs_local;
  Clu_Man_t *p_local;
  
  clk._4_4_ = 0;
  aVar4 = Abc_Clock();
  Aig_ManRandom(1);
  pFVar5 = Fra_SmlSimulateSeq(p->pAig,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  if ((p->fTarget == 0) || (pFVar5->fNonConstOut == 0)) {
    if (p->fVerbose != 0) {
      Abc_Print(1,"%s =","Sim-seq");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    aVar4 = Abc_Clock();
    if ((fRefs != 0) && (Fra_ClausCollectLatchClauses(p,pFVar5), p->fVerbose != 0)) {
      Abc_Print(1,"%s =","Lat-cla");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    aVar4 = Abc_Clock();
    p_00 = Dar_ManComputeCuts(p->pAig,10,0,1);
    if (p->fVerbose != 0) {
      Abc_Print(1,"%s =","Cuts   ");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    aVar4 = Abc_Clock();
    for (j = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), j < iVar1; j = j + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,j);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar7), iVar1 != 0)) {
        Scores._56_8_ = Dar_ObjCuts(pAVar7);
        for (nCuts = 0; nCuts < (int)(uint)(byte)((ulong)*(undefined8 *)&pAVar7->field_0x18 >> 0x38)
            ; nCuts = nCuts + 1) {
          if (((*(uint *)(Scores._56_8_ + 4) >> 0x1c & 1) != 0) &&
             (1 < *(uint *)(Scores._56_8_ + 4) >> 0x1d)) {
            uVar2 = Fra_ClausProcessClausesCut(p,pFVar5,(Dar_Cut_t *)Scores._56_8_,&i);
            *(uint *)(Scores._56_8_ + 4) =
                 *(uint *)(Scores._56_8_ + 4) & 0xffff0000 | uVar2 & 0xffff;
          }
          Scores._56_8_ = Scores._56_8_ + 0x18;
        }
      }
    }
    if (p->fVerbose != 0) {
      Abc_Print(1,"%s =","Infoseq");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    Fra_SmlStop(pFVar5);
    aVar4 = Abc_Clock();
    Aig_ManRandom(1);
    pFVar5 = Fra_SmlSimulateComb(p->pAig,p->nSimWords + p->nSimWordsPref,0);
    if (p->fVerbose != 0) {
      Abc_Print(1,"%s =","Sim-cmb");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    aVar4 = Abc_Clock();
    for (j = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), j < iVar1; j = j + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,j);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar7), iVar1 != 0)) {
        Scores._56_8_ = Dar_ObjCuts(pAVar7);
        for (nCuts = 0; nCuts < (int)(uint)(byte)((ulong)*(undefined8 *)&pAVar7->field_0x18 >> 0x38)
            ; nCuts = nCuts + 1) {
          if (((*(uint *)(Scores._56_8_ + 4) >> 0x1c & 1) != 0) &&
             (1 < *(uint *)(Scores._56_8_ + 4) >> 0x1d)) {
            clk._4_4_ = clk._4_4_ + 1;
            uVar2 = Fra_ClausProcessClausesCut(p,pFVar5,(Dar_Cut_t *)Scores._56_8_,&i);
            uVar2 = (*(uint *)(Scores._56_8_ + 4) & 0xffff ^ 0xffffffff) & uVar2;
            *(uint *)(Scores._56_8_ + 4) = *(uint *)(Scores._56_8_ + 4) & 0xffff0000;
            if (uVar2 != 0) {
              for (local_98 = 0;
                  local_98 < 1 << (byte)((uint)*(undefined4 *)(Scores._56_8_ + 4) >> 0x1d);
                  local_98 = local_98 + 1) {
                if ((uVar2 & 1 << ((byte)local_98 & 0x1f)) != 0) {
                  Fra_ClausRecordClause(p,(Dar_Cut_t *)Scores._56_8_,local_98,(&i)[local_98]);
                }
              }
            }
          }
          Scores._56_8_ = Scores._56_8_ + 0x18;
        }
      }
    }
    Fra_SmlStop(pFVar5);
    Aig_MmFixedStop(p_00,0);
    if (p->fVerbose != 0) {
      Abc_Print(1,"%s =","Infocmb");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    if (p->fVerbose != 0) {
      uVar2 = Aig_ManNodeNum(p->pAig);
      uVar3 = Vec_IntSize(p->vClauses);
      iVar1 = Vec_IntSize(p->vClauses);
      printf("Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n",
             ((double)iVar1 * 1.0) / (double)(int)clk._4_4_,(ulong)uVar2,(ulong)clk._4_4_,
             (ulong)uVar3);
    }
    iVar1 = Vec_IntSize(p->vClauses);
    if (p->nClausesMax < iVar1) {
      Fra_ClausSelectClauses(p);
    }
    else {
      iVar1 = Vec_IntSize(p->vClauses);
      p->nClauses = iVar1;
    }
    p_local._4_4_ = 1;
  }
  else {
    printf("Property failed after sequential simulation!\n");
    Fra_SmlStop(pFVar5);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClausProcessClauses( Clu_Man_t * p, int fRefs )
{
    Aig_MmFixed_t * pMemCuts;
//    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut;
    int Scores[16], uScores, i, k, j, nCuts = 0;
    abctime clk;

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1 );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
//    pManCut = Aig_ComputeCuts( p->pAig, 10, 4, 0, 1 );
if ( p->fVerbose )
{
ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect sequential info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                pCut->uTruth = Fra_ClausProcessClausesCut( p, pSeq, pCut, Scores );
//                uScores = Fra_ClausProcessClausesCut2( p, pSeq, pCut, Scores );
//                if ( uScores != pCut->uTruth )
//                {
//                    int x = 0;
//                }
            }
if ( p->fVerbose )
{
ABC_PRT( "Infoseq", Abc_Clock() - clk );
}
    Fra_SmlStop( pSeq );

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                nCuts++;
                uScores = Fra_ClausProcessClausesCut( p, pComb, pCut, Scores );
                uScores &= ~pCut->uTruth; pCut->uTruth = 0;
                if ( uScores == 0 )
                    continue;
                // write the clauses
                for ( j = 0; j < (1<<pCut->nLeaves); j++ )
                    if ( uScores & (1 << j) )
                        Fra_ClausRecordClause( p, pCut, j, Scores[j] );

            }
    Fra_SmlStop( pComb );
    Aig_MmFixedStop( pMemCuts, 0 );
//    Aig_ManCutStop( pManCut );
if ( p->fVerbose )
{
ABC_PRT( "Infocmb", Abc_Clock() - clk );
}

    if ( p->fVerbose )
    printf( "Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );

    if ( Vec_IntSize(p->vClauses) > p->nClausesMax )
        Fra_ClausSelectClauses( p );
    else
        p->nClauses = Vec_IntSize( p->vClauses );
    return 1;
}